

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3IncrmergeHintPush(Blob *pHint,i64 iAbsLevel,int nInput,int *pRc)

{
  int iVar1;
  int *pRc_local;
  int nInput_local;
  i64 iAbsLevel_local;
  Blob *pHint_local;
  
  blobGrowBuffer(pHint,pHint->n + 0x14,pRc);
  if (*pRc == 0) {
    iVar1 = sqlite3Fts3PutVarint(pHint->a + pHint->n,iAbsLevel);
    pHint->n = iVar1 + pHint->n;
    iVar1 = sqlite3Fts3PutVarint(pHint->a + pHint->n,(long)nInput);
    pHint->n = iVar1 + pHint->n;
  }
  return;
}

Assistant:

static void fts3IncrmergeHintPush(
  Blob *pHint,                    /* Hint blob to append to */
  i64 iAbsLevel,                  /* First varint to store in hint */
  int nInput,                     /* Second varint to store in hint */
  int *pRc                        /* IN/OUT: Error code */
){
  blobGrowBuffer(pHint, pHint->n + 2*FTS3_VARINT_MAX, pRc);
  if( *pRc==SQLITE_OK ){
    pHint->n += sqlite3Fts3PutVarint(&pHint->a[pHint->n], iAbsLevel);
    pHint->n += sqlite3Fts3PutVarint(&pHint->a[pHint->n], (i64)nInput);
  }
}